

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QUtil.cc
# Opt level: O2

string * __thiscall
QUtil::qpdf_time_to_pdf_time_abi_cxx11_(string *__return_storage_ptr__,QUtil *this,QPDFTime *qtm)

{
  int in_ECX;
  uint uVar1;
  string sStack_1b8;
  string local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  string tz_offset;
  string local_f8;
  string local_d8;
  string local_b8;
  string local_98;
  string local_78;
  string local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  tz_offset._M_dataplus._M_p = (pointer)&tz_offset.field_2;
  tz_offset._M_string_length = 0;
  tz_offset.field_2._M_local_buf[0] = '\0';
  uVar1 = *(uint *)(this + 0x18);
  if (uVar1 == 0) {
    std::__cxx11::string::assign((char *)&tz_offset);
  }
  else {
    if ((int)uVar1 < 0) {
      std::__cxx11::string::append((char *)&tz_offset);
      uVar1 = -uVar1;
    }
    else {
      std::__cxx11::string::append((char *)&tz_offset);
    }
    in_ECX = 0x3c;
    int_to_string_abi_cxx11_(&local_198,(QUtil *)((ulong)uVar1 / 0x3c),2,0x3c);
    std::operator+(&local_178,&local_198,"\'");
    int_to_string_abi_cxx11_(&sStack_1b8,(QUtil *)((ulong)uVar1 % 0x3c),2,in_ECX);
    std::operator+(&local_158,&local_178,&sStack_1b8);
    std::operator+(&local_138,&local_158,"\'");
    std::__cxx11::string::append((string *)&tz_offset);
    std::__cxx11::string::~string((string *)&local_138);
    std::__cxx11::string::~string((string *)&local_158);
    std::__cxx11::string::~string((string *)&sStack_1b8);
    std::__cxx11::string::~string((string *)&local_178);
    std::__cxx11::string::~string((string *)&local_198);
  }
  int_to_string_abi_cxx11_(&local_58,(QUtil *)(long)*(int *)this,4,in_ECX);
  std::operator+(&local_38,"D:",&local_58);
  int_to_string_abi_cxx11_(&local_78,(QUtil *)(long)*(int *)(this + 4),2,in_ECX);
  std::operator+(&sStack_1b8,&local_38,&local_78);
  int_to_string_abi_cxx11_(&local_98,(QUtil *)(long)*(int *)(this + 8),2,in_ECX);
  std::operator+(&local_198,&sStack_1b8,&local_98);
  int_to_string_abi_cxx11_(&local_b8,(QUtil *)(long)*(int *)(this + 0xc),2,in_ECX);
  std::operator+(&local_178,&local_198,&local_b8);
  int_to_string_abi_cxx11_(&local_d8,(QUtil *)(long)*(int *)(this + 0x10),2,in_ECX);
  std::operator+(&local_158,&local_178,&local_d8);
  int_to_string_abi_cxx11_(&local_f8,(QUtil *)(long)*(int *)(this + 0x14),2,in_ECX);
  std::operator+(&local_138,&local_158,&local_f8);
  std::operator+(__return_storage_ptr__,&local_138,&tz_offset);
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::~string((string *)&local_f8);
  std::__cxx11::string::~string((string *)&local_158);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_178);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_198);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&sStack_1b8);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&tz_offset);
  return __return_storage_ptr__;
}

Assistant:

std::string
QUtil::qpdf_time_to_pdf_time(QPDFTime const& qtm)
{
    std::string tz_offset;
    int t = qtm.tz_delta;
    if (t == 0) {
        tz_offset = "Z";
    } else {
        if (t < 0) {
            t = -t;
            tz_offset += "+";
        } else {
            tz_offset += "-";
        }
        tz_offset += QUtil::int_to_string(t / 60, 2) + "'" + QUtil::int_to_string(t % 60, 2) + "'";
    }
    return (
        "D:" + QUtil::int_to_string(qtm.year, 4) + QUtil::int_to_string(qtm.month, 2) +
        QUtil::int_to_string(qtm.day, 2) + QUtil::int_to_string(qtm.hour, 2) +
        QUtil::int_to_string(qtm.minute, 2) + QUtil::int_to_string(qtm.second, 2) + tz_offset);
}